

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O2

void __thiscall
pfd::internal::executor::start_process
          (executor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command)

{
  int iVar1;
  __pid_t _Var2;
  uint uVar3;
  int out [2];
  int in [2];
  vector<char_*,_std::allocator<char_*>_> args;
  value_type local_20;
  
  stop(this);
  (this->m_stdout)._M_string_length = 0;
  *(this->m_stdout)._M_dataplus._M_p = '\0';
  this->m_exit_code = -1;
  iVar1 = pipe(in);
  if (iVar1 == 0) {
    iVar1 = pipe(out);
    if (iVar1 == 0) {
      _Var2 = fork();
      this->m_pid = _Var2;
      if (-1 < _Var2) {
        close(in[_Var2 == 0]);
        close(out[this->m_pid != 0]);
        if (this->m_pid == 0) {
          dup2(in[0],0);
          dup2(out[1],1);
          iVar1 = open("/dev/null",1);
          dup2(iVar1,2);
          close(iVar1);
          args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          std::
          transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<char*,std::allocator<char*>>>,pfd::internal::executor::start_process(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(std::__cxx11::string_const&)_1_>
                    ((command->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (command->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
          local_20 = (value_type)0x0;
          std::vector<char_*,_std::allocator<char_*>_>::push_back(&args,&local_20);
          execvp(*args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
                 args.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
          exit(1);
        }
        close(in[1]);
        this->m_fd = out[0];
        uVar3 = fcntl(out[0],3);
        fcntl(this->m_fd,4,(ulong)(uVar3 | 0x800));
        this->m_running = true;
      }
    }
  }
  return;
}

Assistant:

inline void internal::executor::start_process(std::vector<std::string> const &command)
{
    stop();
    m_stdout.clear();
    m_exit_code = -1;

    int in[2], out[2];
    if (pipe(in) != 0 || pipe(out) != 0)
        return;

    m_pid = fork();
    if (m_pid < 0)
        return;

    close(in[m_pid ? 0 : 1]);
    close(out[m_pid ? 1 : 0]);

    if (m_pid == 0)
    {
        dup2(in[0], STDIN_FILENO);
        dup2(out[1], STDOUT_FILENO);

        // Ignore stderr so that it doesn’t pollute the console (e.g. GTK+ errors from zenity)
        int fd = open("/dev/null", O_WRONLY);
        dup2(fd, STDERR_FILENO);
        close(fd);

        std::vector<char *> args;
        std::transform(command.cbegin(), command.cend(), std::back_inserter(args),
                       [](std::string const &s) { return const_cast<char *>(s.c_str()); });
        args.push_back(nullptr); // null-terminate argv[]

        execvp(args[0], args.data());
        exit(1);
    }

    close(in[1]);
    m_fd = out[0];
    auto flags = fcntl(m_fd, F_GETFL);
    fcntl(m_fd, F_SETFL, flags | O_NONBLOCK);

    m_running = true;
}